

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CreateDxf.cpp
# Opt level: O2

void __thiscall CreateDxf::DxfBegin(CreateDxf *this,string *str)

{
  ostream *poVar1;
  ofstream To_Dxf;
  
  std::ofstream::ofstream(&To_Dxf,(string *)str,_S_out);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)&To_Dxf,0);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&To_Dxf,"SECTION");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)&To_Dxf,2);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&To_Dxf,"ENTITIES");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::ofstream::close();
  std::ofstream::~ofstream(&To_Dxf);
  return;
}

Assistant:

void  CreateDxf::DxfBegin (string &str)
{
	// Creation of an output stream object in text mode. Header section of every dxf file. 
	ofstream To_Dxf (str, ios::out);

	To_Dxf << 0		  << endl;
	To_Dxf << "SECTION"  << endl;
	To_Dxf << 2		  << endl;
	To_Dxf << "ENTITIES" << endl;

	To_Dxf.close();
}